

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamwriter.cpp
# Opt level: O0

void __thiscall QCborStreamWriter::append(QCborStreamWriter *this,QCborNegativeInteger n)

{
  QCborStreamWriterPrivate *in_RSI;
  _func_CborError_CborEncoder_ptr_unsigned_long *in_stack_ffffffffffffffe8;
  
  std::unique_ptr<QCborStreamWriterPrivate,_std::default_delete<QCborStreamWriterPrivate>_>::
  operator->((unique_ptr<QCborStreamWriterPrivate,_std::default_delete<QCborStreamWriterPrivate>_> *
             )0x8de1cc);
  QCborStreamWriterPrivate::executeAppend<unsigned_long>(in_RSI,in_stack_ffffffffffffffe8,0x8de1e0);
  return;
}

Assistant:

void QCborStreamWriter::append(QCborNegativeInteger n)
{
    d->executeAppend(cbor_encode_negative_int, uint64_t(n));
}